

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_revxspn(char *s,char *n,size_t len)

{
  int iVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  bool bVar3;
  char *x;
  char *p;
  char *b;
  char *local_30;
  char *local_28;
  
  local_28 = (char *)(in_RDI + -1 + in_RDX);
  local_30 = in_RSI;
  do {
    bVar3 = false;
    if ((char *)(in_RDI + -1) < local_28) {
      bVar3 = *local_30 != '\0';
    }
    local_30 = in_RSI;
    if (!bVar3) {
      return (in_RDI + -1 + in_RDX) - (long)local_28;
    }
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      iVar1 = tolower((int)*local_28);
      iVar2 = tolower((int)*local_30);
      if (iVar1 == iVar2) break;
    }
    local_28 = local_28 + -1;
  } while( true );
}

Assistant:

size_t coda_revxspn(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x = n;

	for (; p > b && *x; --p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}
	}

	return s - 1 + len - p;
}